

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::CreateTar
               (string *outFileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,cmTarCompression compressType,bool verbose,string *mtime,string *format,
               int compressionLevel)

{
  int c;
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  ulong uVar5;
  reference pbVar6;
  string local_4d8;
  string local_4b8;
  string local_498;
  undefined1 local_478 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_438 [7];
  bool tarCreatedSuccessfully;
  byte local_412;
  allocator<char> local_411;
  string local_410;
  undefined1 local_3f0 [8];
  cmArchiveWrite a;
  Compress compress;
  cmAlphaNum local_2e8;
  cmAlphaNum local_2b8;
  undefined1 local_288 [8];
  string e;
  long local_258;
  ofstream fout;
  undefined1 local_58 [8];
  string cwd;
  string *format_local;
  string *mtime_local;
  bool verbose_local;
  cmTarCompression compressType_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *outFileName_local;
  
  cwd.field_2._8_8_ = format;
  GetCurrentWorkingDirectory_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  _Var3 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream(&local_258,pcVar4,_Var3);
  bVar1 = std::ios::operator!((ios *)((long)&local_258 + *(long *)(local_258 + -0x18)));
  if ((bVar1 & 1) == 0) {
    a.PermissionsMask.Value = 0;
    switch(compressType) {
    case TarCompressGZip:
      a.PermissionsMask.Value = 2;
      break;
    case TarCompressBZip2:
      a.PermissionsMask.Value = 3;
      break;
    case TarCompressXZ:
      a.PermissionsMask.Value = 5;
      break;
    case TarCompressZstd:
      a.PermissionsMask.Value = 6;
      break;
    case TarCompressNone:
      a.PermissionsMask.Value = 0;
    }
    c = a.PermissionsMask.Value;
    uVar5 = std::__cxx11::string::empty();
    local_412 = 0;
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::string((string *)&local_410,(string *)cwd.field_2._8_8_);
    }
    else {
      std::allocator<char>::allocator();
      local_412 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"paxr",&local_411);
    }
    cmArchiveWrite::cmArchiveWrite
              ((cmArchiveWrite *)local_3f0,(ostream *)&local_258,c,&local_410,compressionLevel,1);
    std::__cxx11::string::~string((string *)&local_410);
    if ((local_412 & 1) != 0) {
      std::allocator<char>::~allocator(&local_411);
    }
    bVar2 = cmArchiveWrite::Open((cmArchiveWrite *)local_3f0);
    if (bVar2) {
      cmArchiveWrite::SetMTime((cmArchiveWrite *)local_3f0,mtime);
      cmArchiveWrite::SetVerbose((cmArchiveWrite *)local_3f0,verbose);
      __range1._7_1_ = true;
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(files);
      path.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(files);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)((long)&path.field_2 + 8)), bVar2) {
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
        std::__cxx11::string::string((string *)local_478,(string *)pbVar6);
        bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_478);
        if (bVar2) {
          RelativePath(&local_498,(string *)local_58,(string *)local_478);
          std::__cxx11::string::operator=((string *)local_478,(string *)&local_498);
          std::__cxx11::string::~string((string *)&local_498);
        }
        std::__cxx11::string::string((string *)&local_4b8,(string *)local_478);
        bVar2 = cmArchiveWrite::Add((cmArchiveWrite *)local_3f0,&local_4b8,0,(char *)0x0,true);
        std::__cxx11::string::~string((string *)&local_4b8);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          cmArchiveWrite::GetError_abi_cxx11_(&local_4d8,(cmArchiveWrite *)local_3f0);
          Error(&local_4d8);
          std::__cxx11::string::~string((string *)&local_4d8);
          __range1._7_1_ = false;
        }
        std::__cxx11::string::~string((string *)local_478);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      outFileName_local._7_1_ = __range1._7_1_;
    }
    else {
      cmArchiveWrite::GetError_abi_cxx11_((string *)local_438,(cmArchiveWrite *)local_3f0);
      Error((string *)local_438);
      std::__cxx11::string::~string((string *)local_438);
      outFileName_local._7_1_ = false;
    }
    a.PermissionsMask.IsValueSet = true;
    a.PermissionsMask._5_3_ = 0;
    cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_3f0);
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_2b8,"Cannot open output file \"");
    cmAlphaNum::cmAlphaNum(&local_2e8,outFileName);
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    cmStrCat<char[4],std::__cxx11::string>
              ((string *)local_288,&local_2b8,&local_2e8,(char (*) [4])"\": ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compress);
    std::__cxx11::string::~string((string *)&compress);
    Error((string *)local_288);
    outFileName_local._7_1_ = false;
    a.PermissionsMask.IsValueSet = true;
    a.PermissionsMask._5_3_ = 0;
    std::__cxx11::string::~string((string *)local_288);
  }
  std::ofstream::~ofstream(&local_258);
  std::__cxx11::string::~string((string *)local_58);
  return outFileName_local._7_1_;
}

Assistant:

bool cmSystemTools::CreateTar(const std::string& outFileName,
                              const std::vector<std::string>& files,
                              cmTarCompression compressType, bool verbose,
                              std::string const& mtime,
                              std::string const& format, int compressionLevel)
{
#if !defined(CMAKE_BOOTSTRAP)
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  cmsys::ofstream fout(outFileName.c_str(), std::ios::out | std::ios::binary);
  if (!fout) {
    std::string e = cmStrCat("Cannot open output file \"", outFileName,
                             "\": ", cmSystemTools::GetLastSystemError());
    cmSystemTools::Error(e);
    return false;
  }
  cmArchiveWrite::Compress compress = cmArchiveWrite::CompressNone;
  switch (compressType) {
    case TarCompressGZip:
      compress = cmArchiveWrite::CompressGZip;
      break;
    case TarCompressBZip2:
      compress = cmArchiveWrite::CompressBZip2;
      break;
    case TarCompressXZ:
      compress = cmArchiveWrite::CompressXZ;
      break;
    case TarCompressZstd:
      compress = cmArchiveWrite::CompressZstd;
      break;
    case TarCompressNone:
      compress = cmArchiveWrite::CompressNone;
      break;
  }

  cmArchiveWrite a(fout, compress, format.empty() ? "paxr" : format,
                   compressionLevel);

  if (!a.Open()) {
    cmSystemTools::Error(a.GetError());
    return false;
  }
  a.SetMTime(mtime);
  a.SetVerbose(verbose);
  bool tarCreatedSuccessfully = true;
  for (auto path : files) {
    if (cmSystemTools::FileIsFullPath(path)) {
      // Get the relative path to the file.
      path = cmSystemTools::RelativePath(cwd, path);
    }
    if (!a.Add(path)) {
      cmSystemTools::Error(a.GetError());
      tarCreatedSuccessfully = false;
    }
  }
  return tarCreatedSuccessfully;
#else
  (void)outFileName;
  (void)files;
  (void)verbose;
  return false;
#endif
}